

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__expand_png_palette(stbi__png *a,stbi_uc *palette,int len,int pal_img_n)

{
  long lVar1;
  uint uVar2;
  int iVar3;
  undefined1 *puVar4;
  int in_ECX;
  long in_RSI;
  long *in_RDI;
  int n_1;
  int n;
  stbi_uc *orig;
  stbi_uc *temp_out;
  stbi_uc *p;
  stbi__uint32 pixel_count;
  stbi__uint32 i;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined1 *local_30;
  uint local_24;
  int local_4;
  
  uVar2 = *(int *)*in_RDI * *(int *)(*in_RDI + 4);
  lVar1 = in_RDI[3];
  puVar4 = (undefined1 *)stbi__malloc_mad2(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,0);
  if (puVar4 == (undefined1 *)0x0) {
    local_4 = stbi__err("outofmem");
  }
  else {
    local_30 = puVar4;
    if (in_ECX == 3) {
      for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
        iVar3 = (uint)*(byte *)(lVar1 + (ulong)local_24) * 4;
        *local_30 = *(undefined1 *)(in_RSI + iVar3);
        local_30[1] = *(undefined1 *)(in_RSI + (iVar3 + 1));
        local_30[2] = *(undefined1 *)(in_RSI + (iVar3 + 2));
        local_30 = local_30 + 3;
      }
    }
    else {
      for (local_24 = 0; local_24 < uVar2; local_24 = local_24 + 1) {
        iVar3 = (uint)*(byte *)(lVar1 + (ulong)local_24) * 4;
        *local_30 = *(undefined1 *)(in_RSI + iVar3);
        local_30[1] = *(undefined1 *)(in_RSI + (iVar3 + 1));
        local_30[2] = *(undefined1 *)(in_RSI + (iVar3 + 2));
        local_30[3] = *(undefined1 *)(in_RSI + (iVar3 + 3));
        local_30 = local_30 + 4;
      }
    }
    free((void *)in_RDI[3]);
    in_RDI[3] = (long)puVar4;
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__expand_png_palette(stbi__png *a, stbi_uc *palette, int len, int pal_img_n)
{
   stbi__uint32 i, pixel_count = a->s->img_x * a->s->img_y;
   stbi_uc *p, *temp_out, *orig = a->out;

   p = (stbi_uc *) stbi__malloc_mad2(pixel_count, pal_img_n, 0);
   if (p == NULL) return stbi__err("outofmem", "Out of memory");

   // between here and free(out) below, exitting would leak
   temp_out = p;

   if (pal_img_n == 3) {
      for (i=0; i < pixel_count; ++i) {
         int n = orig[i]*4;
         p[0] = palette[n  ];
         p[1] = palette[n+1];
         p[2] = palette[n+2];
         p += 3;
      }
   } else {
      for (i=0; i < pixel_count; ++i) {
         int n = orig[i]*4;
         p[0] = palette[n  ];
         p[1] = palette[n+1];
         p[2] = palette[n+2];
         p[3] = palette[n+3];
         p += 4;
      }
   }
   STBI_FREE(a->out);
   a->out = temp_out;

   STBI_NOTUSED(len);

   return 1;
}